

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall Minisat::IntOption::giveRndValue(IntOption *this,string *optionText)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  ostringstream strs;
  ulong *local_218;
  long local_210;
  ulong local_208;
  long lStack_200;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  iVar2 = (this->range).begin;
  iVar3 = rand();
  iVar3 = iVar3 + iVar2;
  iVar2 = (this->range).end;
  if (iVar2 < iVar3) {
    do {
      iVar3 = (iVar3 - iVar2) + (this->range).begin;
    } while (iVar2 < iVar3);
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::operator<<((ostream *)local_198,iVar3);
  std::operator+(&local_1b8,"-",optionText);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_208 = *puVar6;
    lStack_200 = plVar4[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar6;
    local_218 = (ulong *)*plVar4;
  }
  local_210 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::stringbuf::str();
  uVar7 = 0xf;
  if (local_218 != &local_208) {
    uVar7 = local_208;
  }
  if (uVar7 < (ulong)(local_1d0 + local_210)) {
    uVar7 = 0xf;
    if (local_1d8 != local_1c8) {
      uVar7 = local_1c8[0];
    }
    if ((ulong)(local_1d0 + local_210) <= uVar7) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_218);
      goto LAB_0010747d;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1d8);
LAB_0010747d:
  local_1f8 = &local_1e8;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_1e8 = *puVar1;
    uStack_1e0 = puVar5[3];
  }
  else {
    local_1e8 = *puVar1;
    local_1f8 = (undefined8 *)*puVar5;
  }
  local_1f0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=((string *)optionText,(string *)&local_1f8);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void giveRndValue(std::string &optionText)
    {
        int rndV = range.begin;
        rndV += rand();
        while (rndV > range.end) {
            rndV -= range.end - range.begin;
        }
        std::ostringstream strs;
        strs << rndV;
        optionText = "-" + optionText + "=" + strs.str();
    }